

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[4],kj::Repeat<char>,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],Repeat<char> *params_1,
          char (*params_2) [2])

{
  char (*value) [4];
  Repeat<char> *value_00;
  char (*value_01) [2];
  Repeat<char> RVar1;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Repeat<char> *local_28;
  char (*params_local_2) [2];
  Repeat<char> *params_local_1;
  char (*params_local) [4];
  
  local_28 = params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (Repeat<char> *)this;
  params_local = (char (*) [4])__return_storage_ptr__;
  value = ::const((char (*) [4])this);
  local_38 = toCharSequence<char_const(&)[4]>(value);
  value_00 = fwd<kj::Repeat<char>>((NoInfer<kj::Repeat<char>_> *)params_local_2);
  RVar1 = toCharSequence<kj::Repeat<char>>(value_00);
  local_48.size_ = RVar1.count;
  local_48.ptr._0_1_ = RVar1.value;
  value_01 = ::const(&local_28->value);
  local_58 = toCharSequence<char_const(&)[2]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,(Repeat<char> *)&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}